

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ValidOneofFieldImplicitClosed_Test::
~FeaturesTest_ValidOneofFieldImplicitClosed_Test
          (FeaturesTest_ValidOneofFieldImplicitClosed_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest((ValidationErrorTest *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, ValidOneofFieldImplicitClosed) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        options { features { field_presence: IMPLICIT } }
        message_type {
          name: "Foo"
          field {
            name: "bar"
            number: 1
            label: LABEL_OPTIONAL
            type: TYPE_ENUM
            type_name: "Enum"
            oneof_index: 0
          }
          oneof_decl { name: "_foo" }
        }
        enum_type {
          name: "Enum"
          value { name: "BAR" number: 0 }
          options { features { enum_type: CLOSED } }
        }
      )pb");
  ASSERT_THAT(file, NotNull());

  EXPECT_TRUE(file->message_type(0)->field(0)->has_presence());
  EXPECT_TRUE(file->enum_type(0)->is_closed());
}